

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

statusline checkhttpprefix(Curl_easy *data,char *s,size_t len)

{
  char *__s;
  int iVar1;
  statusline sVar2;
  size_t max;
  size_t max_00;
  statusline sVar3;
  curl_slist *pcVar4;
  
  for (pcVar4 = (data->set).http200aliases; sVar3 = STATUS_BAD, pcVar4 != (curl_slist *)0x0;
      pcVar4 = pcVar4->next) {
    __s = pcVar4->data;
    max = strlen(__s);
    if (len <= max) {
      max = len;
    }
    iVar1 = curl_strnequal(__s,s,max);
    sVar3 = (uint)(4 < len);
    if (iVar1 != 0) break;
  }
  sVar2 = STATUS_DONE;
  if (sVar3 != STATUS_DONE) {
    max_00 = 5;
    if (len < 5) {
      max_00 = len;
    }
    iVar1 = curl_strnequal("HTTP/",s,max_00);
    sVar2 = (uint)(4 < len);
    if (iVar1 == 0) {
      sVar2 = sVar3;
    }
  }
  return sVar2;
}

Assistant:

static statusline
checkhttpprefix(struct Curl_easy *data,
                const char *s, size_t len)
{
  struct curl_slist *head = data->set.http200aliases;
  statusline rc = STATUS_BAD;
  statusline onmatch = len >= 5? STATUS_DONE : STATUS_UNKNOWN;

  while(head) {
    if(checkprefixmax(head->data, s, len)) {
      rc = onmatch;
      break;
    }
    head = head->next;
  }

  if((rc != STATUS_DONE) && (checkprefixmax("HTTP/", s, len)))
    rc = onmatch;

  return rc;
}